

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_ui_pum_set_height(Nvim *this,Integer height)

{
  allocator local_41;
  Integer local_40;
  string local_38;
  
  local_40 = height;
  std::__cxx11::string::string((string *)&local_38,"nvim_ui_pum_set_height",&local_41);
  NvimRPC::async_call<long>(&this->client_,&local_38,&local_40);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::async_ui_pum_set_height(Integer height) {
    client_.async_call("nvim_ui_pum_set_height", height);
}